

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

greatest_test_res generic_pack_unpack_le_f_should_match(void)

{
  greatest_test_res gVar1;
  char *greatest_FMT;
  float unpack;
  uint8_t buf [4];
  float wrote;
  
  unpack = random_float();
  pack_le_f((void *)((long)&greatest_FMT + 4),unpack);
  unpack_le_f((float *)&greatest_FMT,(void *)((long)&greatest_FMT + 4));
  greatest_info.assertions = greatest_info.assertions + 1;
  if ((unpack != greatest_FMT._0_4_) || (NAN(unpack) || NAN(greatest_FMT._0_4_))) {
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%f",(double)unpack);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%f",(double)greatest_FMT._0_4_);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    greatest_info.fail_line = 0x1e7;
    greatest_info.msg = "wrote != unpack";
    buf[0] = 0xff;
    buf[1] = 0xff;
    buf[2] = 0xff;
    buf[3] = 0xff;
  }
  else {
    greatest_info.msg = (char *)0x0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
  }
  gVar1._0_1_ = buf[0];
  gVar1._1_1_ = buf[1];
  gVar1._2_1_ = buf[2];
  gVar1._3_1_ = buf[3];
  return gVar1;
}

Assistant:

TEST
generic_pack_unpack_le_f_should_match(void) {
    float   wrote = random_float();
    uint8_t buf[sizeof(wrote)];
    pack_le_f(buf, wrote);
    float unpack;
    unpack_le_f(&unpack, buf);
    ASSERT_EQ_FMT(wrote, unpack, "%f");
    PASS();
}